

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void luaC_step(lua_State *L)

{
  lu_byte lVar1;
  global_State *g;
  l_mem lVar2;
  l_mem lVar3;
  GCObject **ppGVar4;
  l_mem lVar5;
  long lVar6;
  l_mem lVar7;
  l_mem addedold1;
  l_mem local_40;
  GCObject *local_38;
  
  g = L->l_G;
  if (g->gcstp == 0) {
    lVar1 = g->gckind;
    if (lVar1 != '\x02') {
      if (lVar1 == '\x01') {
        local_40 = 0;
        lVar6 = g->GCmarked;
        if (g->firstold1 != (GCObject *)0x0) {
          markold(g,g->firstold1,g->reallyold);
          g->firstold1 = (GCObject *)0x0;
        }
        markold(g,g->finobj,g->finobjrold);
        markold(g,g->tobefnz,(GCObject *)0x0);
        atomic(L);
        g->gcstate = '\x03';
        ppGVar4 = sweepgen(L,(global_State *)(ulong)g->currentwhite,&g->allgc,g->survival,
                           &g->firstold1,&local_40);
        sweepgen(L,(global_State *)(ulong)g->currentwhite,ppGVar4,g->old1,&g->firstold1,&local_40);
        g->reallyold = g->old1;
        g->old1 = *ppGVar4;
        g->survival = g->allgc;
        local_38 = (GCObject *)0x0;
        ppGVar4 = sweepgen(L,(global_State *)(ulong)g->currentwhite,&g->finobj,g->finobjsur,
                           &local_38,&local_40);
        sweepgen(L,(global_State *)(ulong)g->currentwhite,ppGVar4,g->finobjold1,&local_38,&local_40)
        ;
        g->finobjrold = g->finobjold1;
        g->finobjold1 = *ppGVar4;
        g->finobjsur = g->finobj;
        sweepgen(L,(global_State *)(ulong)g->currentwhite,&g->tobefnz,(GCObject *)0x0,&local_38,
                 &local_40);
        g->GCmarked = lVar6 + local_40;
        lVar5 = luaO_applyparam(g->gcparams[2],g->GCmajorminor);
        if ((lVar5 == 0) || (g->GCmarked < lVar5)) {
          finishgencycle(L,g);
        }
        else {
          minor2inc(L,g,'\x02');
          g->GCmarked = 0;
        }
        lVar5 = luaO_applyparam(g->gcparams[0],g->GCmajorminor);
        goto LAB_0010e9a3;
      }
      if (lVar1 != '\0') {
        return;
      }
    }
    lVar5 = luaO_applyparam(g->gcparams[5],100);
    lVar6 = lVar5 + 7;
    if (-1 < lVar5) {
      lVar6 = lVar5;
    }
    lVar2 = luaO_applyparam(g->gcparams[4],lVar6 >> 3);
    lVar7 = lVar2;
    while (lVar3 = singlestep(L,(uint)(lVar2 == 0)), lVar3 != -3) {
      if (lVar3 == -1) {
        return;
      }
      if ((lVar2 != 0 && lVar3 == -2) || (lVar7 = lVar7 - lVar3, lVar7 < 1 && lVar2 != 0)) break;
    }
    if (g->gcstate == '\b') {
      setpause(g);
      return;
    }
  }
  else {
    if ((g->gcstp & 1) == 0) {
      return;
    }
    lVar5 = 20000;
  }
LAB_0010e9a3:
  luaE_setdebt(g,lVar5);
  return;
}

Assistant:

void luaC_step (lua_State *L) {
  global_State *g = G(L);
  lua_assert(!g->gcemergency);
  if (!gcrunning(g)) {  /* not running? */
    if (g->gcstp & GCSTPUSR)  /* stopped by the user? */
      luaE_setdebt(g, 20000);
  }
  else {
    luai_tracegc(L, 1);  /* for internal debugging */
    switch (g->gckind) {
      case KGC_INC: case KGC_GENMAJOR:
        incstep(L, g);
        break;
      case KGC_GENMINOR:
        youngcollection(L, g);
        setminordebt(g);
        break;
    }
    luai_tracegc(L, 0);  /* for internal debugging */
  }
}